

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O3

SDKConnection * __thiscall MyServer::OnIncomingConnection(MyServer *this,TonkAddress *address)

{
  shared_ptr<MyServerConnection> ptr;
  undefined1 local_29;
  SDKConnection *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  MyServer *local_18;
  
  local_18 = this;
  std::__shared_ptr<MyServerConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<MyServerConnection>,MyServer*>
            ((__shared_ptr<MyServerConnection,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (allocator<MyServerConnection> *)&local_29,&local_18);
  tonk::SDKConnectionList<MyServerConnection>::Insert(&this->ConnectionList,local_28);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return local_28;
}

Assistant:

tonk::SDKConnection* MyServer::OnIncomingConnection(
    const TonkAddress& address ///< Address of the client requesting a connection
)
{
    auto ptr = std::make_shared<MyServerConnection>(this);

    // Insert into connection list to prevent it from going out of scope
    ConnectionList.Insert(ptr.get());

    return ptr.get();
}